

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall FactoredDecPOMDPDiscrete::InitializeStorage(FactoredDecPOMDPDiscrete *this)

{
  size_type in_stack_00000008;
  size_type in_stack_00000018;
  vector<RewardModel_*,_std::allocator<RewardModel_*>_> *in_stack_00000020;
  
  std::vector<Scope,_std::allocator<Scope>_>::clear
            ((vector<Scope,_std::allocator<Scope>_> *)0xade8ce);
  std::vector<Scope,_std::allocator<Scope>_>::clear
            ((vector<Scope,_std::allocator<Scope>_> *)0xade8de);
  std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::clear
            ((vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)0xade8ee);
  std::vector<Scope,_std::allocator<Scope>_>::resize
            ((vector<Scope,_std::allocator<Scope>_> *)this,in_stack_00000008);
  std::vector<Scope,_std::allocator<Scope>_>::resize
            ((vector<Scope,_std::allocator<Scope>_> *)this,in_stack_00000008);
  std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::resize
            (in_stack_00000020,in_stack_00000018,(value_type *)this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,in_stack_00000008);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,in_stack_00000008);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)this,in_stack_00000008);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)this,in_stack_00000008);
  return;
}

Assistant:

void FactoredDecPOMDPDiscrete::InitializeStorage()
{
    _m_sfScopes.clear();
    _m_agScopes.clear();
    _m_LRFs.clear();
    _m_sfScopes.resize(_m_nrLRFs);
    _m_agScopes.resize(_m_nrLRFs);
    _m_LRFs.resize(_m_nrLRFs, 0);
    
    //allocate storage for the instantiation information
    _m_nrXIs.resize(_m_nrLRFs);
    _m_nrAIs.resize(_m_nrLRFs);
    _m_nrSFVals.resize(_m_nrLRFs);
    _m_nrActionVals.resize(_m_nrLRFs);
}